

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::detail::arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler>::
char_spec_handler::on_int(char_spec_handler *this)

{
  char cVar1;
  arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler> *this_00;
  checked_ptr<typename_buffer<char>::value_type> pcVar2;
  
  this_00 = this->formatter;
  cVar1 = this->value;
  if (this_00->specs_ != (format_specs *)0x0) {
    write_int<int>(this_00,(int)cVar1,this_00->specs_);
    return;
  }
  pcVar2 = reserve(this_00,1);
  *pcVar2 = cVar1;
  return;
}

Assistant:

void on_int() {
      if (formatter.specs_)
        formatter.write_int(static_cast<int>(value), *formatter.specs_);
      else
        formatter.write(value);
    }